

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _h;
  int _d;
  int iVar2;
  int _elempack;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  byte bVar10;
  byte bVar11;
  unsigned_short uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  void *pvVar17;
  size_t sVar18;
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [64];
  ulong uVar23;
  uint uVar24;
  undefined1 (*pauVar25) [64];
  undefined1 (*pauVar26) [32];
  uint uVar27;
  long lVar28;
  undefined1 (*pauVar29) [16];
  ushort uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar33 [32];
  
  iVar14 = (this->super_Cast).type_from;
  iVar13 = (this->super_Cast).type_to;
  if (iVar14 == iVar13) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar14 = bottom_blob->w;
    iVar13 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar14;
    top_blob->h = iVar13;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar1 = bottom_blob->w;
  _h = bottom_blob->h;
  _d = bottom_blob->d;
  uVar16 = bottom_blob->c;
  iVar2 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar18 = (size_t)_elempack;
  switch(iVar13) {
  case 1:
    if (iVar14 == 3) {
      Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
    }
    sVar18 = sVar18 * 4;
    break;
  case 2:
  case 4:
    sVar18 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar18 = bottom_blob->elemsize;
  }
  switch(iVar2) {
  case 1:
    Mat::create(top_blob,iVar1,sVar18,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar1,_h,sVar18,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar1,_h,uVar16,sVar18,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar1,_h,_d,uVar16,sVar18,_elempack,opt->blob_allocator);
  }
  auVar31 = in_ZMM6._0_16_;
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  iVar14 = (this->super_Cast).type_from;
  iVar13 = (this->super_Cast).type_to;
  if (iVar13 == 2 && iVar14 == 1) {
    iVar14 = bottom_blob->c;
    if ((long)iVar14 < 1) goto LAB_0046dff2;
    uVar27 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar19 = 0;
    do {
      pauVar25 = (undefined1 (*) [64])
                 (bottom_blob->cstep * lVar19 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar29 = (undefined1 (*) [16])
                 (top_blob->cstep * lVar19 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar27 < 0x10) {
        uVar24 = 0;
      }
      else {
        iVar13 = 0xf;
        do {
          auVar35 = vmovdqu64_avx512f(*pauVar25);
          auVar31 = vcvtps2ph_avx512vl(auVar35._0_16_,0);
          *(long *)*pauVar29 = auVar31._0_8_;
          *(undefined8 *)(*pauVar29 + 8) = 0;
          *(undefined8 *)pauVar29[1] = 0;
          *(undefined8 *)(pauVar29[1] + 8) = 0;
          pauVar25 = pauVar25 + 1;
          pauVar29 = pauVar29 + 2;
          iVar13 = iVar13 + 0x10;
          uVar24 = uVar27 & 0xfffffff0;
        } while (iVar13 < (int)uVar27);
      }
      uVar15 = uVar24 | 7;
      while ((int)uVar15 < (int)uVar27) {
        auVar31 = vcvtps2ph_f16c(*(undefined1 (*) [32])*pauVar25,8);
        *pauVar29 = auVar31;
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
        pauVar29 = pauVar29 + 1;
        uVar15 = uVar24 + 0xf;
        uVar24 = uVar24 + 8;
      }
      uVar15 = uVar24 | 3;
      while ((int)uVar15 < (int)uVar27) {
        vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar25,8);
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
        pauVar29 = (undefined1 (*) [16])(*pauVar29 + 8);
        uVar15 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      if (uVar27 - uVar24 != 0 && (int)uVar24 <= (int)uVar27) {
        lVar28 = 0;
        do {
          in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
          uVar12 = float32_to_float16(*(float *)(*pauVar25 + lVar28 * 4));
          *(unsigned_short *)(*pauVar29 + lVar28 * 2) = uVar12;
          lVar28 = lVar28 + 1;
        } while (uVar27 - uVar24 != (int)lVar28);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != iVar14);
    iVar14 = (this->super_Cast).type_from;
    iVar13 = (this->super_Cast).type_to;
  }
  auVar31 = in_ZMM6._0_16_;
  if (iVar13 == 1 && iVar14 == 2) {
    iVar14 = bottom_blob->c;
    if ((long)iVar14 < 1) goto LAB_0046dff2;
    uVar27 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar19 = 0;
    do {
      pauVar26 = (undefined1 (*) [32])
                 (bottom_blob->cstep * lVar19 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar25 = (undefined1 (*) [64])
                 (top_blob->cstep * lVar19 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar27 < 0x10) {
        uVar24 = 0;
      }
      else {
        iVar13 = 0xf;
        do {
          auVar35 = vcvtph2ps_avx512f(*pauVar26);
          auVar35 = vmovdqu64_avx512f(auVar35);
          *pauVar25 = auVar35;
          pauVar26 = pauVar26 + 1;
          pauVar25 = pauVar25 + 1;
          iVar13 = iVar13 + 0x10;
          uVar24 = uVar27 & 0xfffffff0;
        } while (iVar13 < (int)uVar27);
      }
      uVar15 = uVar24 | 7;
      while ((int)uVar15 < (int)uVar27) {
        auVar33 = vcvtph2ps_f16c(*(undefined1 (*) [16])*pauVar26);
        *(undefined1 (*) [32])*pauVar25 = auVar33;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
        uVar15 = uVar24 + 0xf;
        uVar24 = uVar24 + 8;
      }
      uVar15 = uVar24 | 3;
      while ((int)uVar15 < (int)uVar27) {
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)*pauVar26;
        auVar31 = vcvtph2ps_f16c(auVar31);
        *(undefined1 (*) [16])*pauVar25 = auVar31;
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + 8);
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
        uVar15 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      if (uVar27 - uVar24 != 0 && (int)uVar24 <= (int)uVar27) {
        lVar28 = 0;
        do {
          in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
          fVar41 = float16_to_float32(*(unsigned_short *)(*pauVar26 + lVar28 * 2));
          *(float *)(*pauVar25 + lVar28 * 4) = fVar41;
          lVar28 = lVar28 + 1;
        } while (uVar27 - uVar24 != (int)lVar28);
      }
      auVar31 = in_ZMM6._0_16_;
      lVar19 = lVar19 + 1;
    } while (lVar19 != iVar14);
    iVar14 = (this->super_Cast).type_from;
    iVar13 = (this->super_Cast).type_to;
  }
  if (0 < (int)uVar16 && (iVar13 == 1 && iVar14 == 3)) {
    uVar27 = _d * _elempack * _h * iVar1;
    pvVar17 = bottom_blob->data;
    sVar18 = bottom_blob->cstep;
    pvVar20 = top_blob->data;
    sVar4 = top_blob->cstep;
    sVar5 = top_blob->elemsize;
    sVar6 = bottom_blob->elemsize;
    uVar21 = 0;
    do {
      if (0 < (int)uVar27) {
        uVar23 = 0;
        do {
          *(float *)((long)pvVar20 + uVar23 * 4) = (float)(int)*(char *)((long)pvVar17 + uVar23);
          uVar23 = uVar23 + 1;
        } while (uVar27 != uVar23);
      }
      uVar21 = uVar21 + 1;
      pvVar20 = (void *)((long)pvVar20 + sVar4 * sVar5);
      pvVar17 = (void *)((long)pvVar17 + sVar18 * sVar6);
    } while (uVar21 != uVar16);
    iVar13 = (this->super_Cast).type_to;
  }
  if ((iVar14 == 1) && (iVar13 == 4)) {
    iVar14 = cpu_support_x86_avx512_bf16();
    if (iVar14 == 0) {
      iVar14 = bottom_blob->c;
      if (0 < (long)iVar14) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar19 = 0;
        auVar35 = vpmovsxbw_avx512bw(_DAT_005b0c79);
        auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          pauVar25 = (undefined1 (*) [64])
                     (bottom_blob->cstep * lVar19 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar22 = (undefined1 (*) [64])
                     (top_blob->cstep * lVar19 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 0x20) {
            uVar27 = 0;
          }
          else {
            iVar13 = 0x1f;
            do {
              auVar39 = vmovdqu64_avx512f(*pauVar25);
              auVar39 = vpermt2w_avx512bw(auVar39,auVar35,pauVar25[1]);
              auVar39 = vmovdqu64_avx512f(auVar39);
              *pauVar22 = auVar39;
              pauVar25 = pauVar25 + 2;
              pauVar22 = pauVar22 + 1;
              iVar13 = iVar13 + 0x20;
              uVar27 = uVar16 & 0xffffffe0;
            } while (iVar13 < (int)uVar16);
          }
          uVar24 = uVar27 | 0xf;
          while ((int)uVar24 < (int)uVar16) {
            auVar39 = vpsrld_avx512f(*pauVar25,0x10);
            auVar33 = vpmovdw_avx512f(auVar39);
            *(undefined1 (*) [32])*pauVar22 = auVar33;
            pauVar25 = pauVar25 + 1;
            pauVar22 = (undefined1 (*) [64])(*pauVar22 + 0x20);
            uVar24 = uVar27 + 0x1f;
            uVar27 = uVar27 + 0x10;
          }
          uVar24 = uVar27 | 7;
          while ((int)uVar24 < (int)uVar16) {
            auVar33 = vpsrld_avx512vl(*(undefined1 (*) [32])*pauVar25,0x10);
            auVar42 = vpackusdw_avx(auVar33._0_16_,auVar33._16_16_);
            *(undefined1 (*) [16])*pauVar22 = auVar42;
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
            pauVar22 = (undefined1 (*) [64])(*pauVar22 + 0x10);
            uVar24 = uVar27 + 0xf;
            uVar27 = uVar27 + 8;
          }
          if ((int)uVar27 < (int)uVar16) {
            auVar39 = vpbroadcastq_avx512f();
            uVar21 = 0;
            do {
              auVar40 = vpbroadcastq_avx512f();
              auVar36 = vporq_avx512f(auVar40,auVar37);
              auVar40 = vporq_avx512f(auVar40,auVar38);
              uVar8 = vpcmpuq_avx512f(auVar40,auVar39,2);
              bVar10 = (byte)uVar8;
              uVar8 = vpcmpuq_avx512f(auVar36,auVar39,2);
              bVar11 = (byte)uVar8;
              uVar30 = CONCAT11(bVar11,bVar10);
              auVar40 = vmovdqu32_avx512f(*(undefined1 (*) [64])(*pauVar25 + uVar21 * 4));
              auVar36._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar40._4_4_;
              auVar36._0_4_ = (uint)(bVar10 & 1) * auVar40._0_4_;
              auVar36._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar40._8_4_;
              auVar36._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar40._12_4_;
              auVar36._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar40._16_4_;
              auVar36._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar40._20_4_;
              auVar36._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar40._24_4_;
              auVar36._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar40._28_4_;
              auVar36._32_4_ = (uint)(bVar11 & 1) * auVar40._32_4_;
              auVar36._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar40._36_4_;
              auVar36._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar40._40_4_;
              auVar36._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar40._44_4_;
              auVar36._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar40._48_4_;
              auVar36._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar40._52_4_;
              auVar36._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar40._56_4_;
              auVar36._60_4_ = (uint)(bVar11 >> 7) * auVar40._60_4_;
              auVar40 = vpsrld_avx512f(auVar36,0x10);
              pauVar26 = (undefined1 (*) [32])(*pauVar22 + uVar21 * 2);
              auVar33 = vpmovdw_avx512f(auVar40);
              auVar32._0_2_ =
                   (ushort)(bVar10 & 1) * auVar33._0_2_ |
                   (ushort)!(bool)(bVar10 & 1) * *(short *)*pauVar26;
              bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar32._2_2_ =
                   (ushort)bVar7 * auVar33._2_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 2);
              bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
              auVar32._4_2_ =
                   (ushort)bVar7 * auVar33._4_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 4);
              bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
              auVar32._6_2_ =
                   (ushort)bVar7 * auVar33._6_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 6);
              bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
              auVar32._8_2_ =
                   (ushort)bVar7 * auVar33._8_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 8);
              bVar7 = (bool)((byte)(uVar30 >> 5) & 1);
              auVar32._10_2_ =
                   (ushort)bVar7 * auVar33._10_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 10);
              bVar7 = (bool)((byte)(uVar30 >> 6) & 1);
              auVar32._12_2_ =
                   (ushort)bVar7 * auVar33._12_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 0xc);
              bVar7 = (bool)((byte)(uVar30 >> 7) & 1);
              auVar32._14_2_ =
                   (ushort)bVar7 * auVar33._14_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 0xe);
              auVar32._16_2_ =
                   (ushort)(bVar11 & 1) * auVar33._16_2_ |
                   (ushort)!(bool)(bVar11 & 1) * *(short *)(*pauVar26 + 0x10);
              bVar7 = (bool)(bVar11 >> 1 & 1);
              auVar32._18_2_ =
                   (ushort)bVar7 * auVar33._18_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 0x12);
              bVar7 = (bool)(bVar11 >> 2 & 1);
              auVar32._20_2_ =
                   (ushort)bVar7 * auVar33._20_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 0x14);
              bVar7 = (bool)(bVar11 >> 3 & 1);
              auVar32._22_2_ =
                   (ushort)bVar7 * auVar33._22_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 0x16);
              bVar7 = (bool)(bVar11 >> 4 & 1);
              auVar32._24_2_ =
                   (ushort)bVar7 * auVar33._24_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 0x18);
              bVar7 = (bool)(bVar11 >> 5 & 1);
              auVar32._26_2_ =
                   (ushort)bVar7 * auVar33._26_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 0x1a);
              bVar7 = (bool)(bVar11 >> 6 & 1);
              auVar32._28_2_ =
                   (ushort)bVar7 * auVar33._28_2_ | (ushort)!bVar7 * *(short *)(*pauVar26 + 0x1c);
              auVar32._30_2_ =
                   (ushort)(bVar11 >> 7) * auVar33._30_2_ |
                   (ushort)!(bool)(bVar11 >> 7) * *(short *)(*pauVar26 + 0x1e);
              *pauVar26 = auVar32;
              uVar21 = uVar21 + 0x10;
            } while (((ulong)(~uVar27 + uVar16) + 0x10 & 0x1fffffff0) != uVar21);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != iVar14);
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
LAB_0046dff2:
  if (((this->super_Cast).type_from == 4) && ((this->super_Cast).type_to == 1)) {
    auVar35 = ZEXT1664(auVar31);
    iVar14 = cpu_support_x86_avx512_bf16();
    if (iVar14 == 0) {
      iVar14 = bottom_blob->c;
      if (0 < (long)iVar14) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar19 = 0;
        auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          pauVar26 = (undefined1 (*) [32])
                     (bottom_blob->cstep * lVar19 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar25 = (undefined1 (*) [64])
                     (top_blob->cstep * lVar19 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 0x10) {
            uVar27 = 0;
          }
          else {
            iVar13 = 0xf;
            auVar39 = auVar35;
            do {
              auVar32 = vpunpcklwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar26);
              auVar33 = vpunpckhwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar26);
              auVar35._0_16_ = ZEXT116(0) * auVar33._0_16_ + ZEXT116(1) * auVar32._0_16_;
              auVar35._32_32_ = auVar39._32_32_;
              auVar35._16_16_ = ZEXT116(0) * auVar32._16_16_ + ZEXT116(1) * auVar33._0_16_;
              auVar33 = vperm2i128_avx2(auVar32,auVar33,0x31);
              auVar39 = vinserti64x4_avx512f(auVar35,auVar33,1);
              auVar39 = vmovdqu64_avx512f(auVar39);
              *pauVar25 = auVar39;
              pauVar26 = pauVar26 + 1;
              pauVar25 = pauVar25 + 1;
              iVar13 = iVar13 + 0x10;
              auVar39 = auVar35;
              uVar27 = uVar16 & 0xfffffff0;
            } while (iVar13 < (int)uVar16);
          }
          uVar24 = uVar27 | 7;
          while ((int)uVar24 < (int)uVar16) {
            auVar42 = vpunpcklwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar26);
            auVar31 = vpunpckhwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar26);
            *(undefined1 (*) [16])(*pauVar25 + 0x10) = auVar31;
            *(undefined1 (*) [16])*pauVar25 = auVar42;
            pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
            uVar24 = uVar27 + 0xf;
            uVar27 = uVar27 + 8;
          }
          uVar24 = uVar27 | 3;
          while ((int)uVar24 < (int)uVar16) {
            auVar42._8_8_ = 0;
            auVar42._0_8_ = *(ulong *)*pauVar26;
            auVar31 = vpunpcklwd_avx((undefined1  [16])0x0,auVar42);
            *(undefined1 (*) [16])*pauVar25 = auVar31;
            pauVar26 = (undefined1 (*) [32])(*pauVar26 + 8);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
            uVar24 = uVar27 + 7;
            uVar27 = uVar27 + 4;
          }
          if ((int)uVar27 < (int)uVar16) {
            auVar39 = vpbroadcastq_avx512f();
            uVar21 = 0;
            do {
              auVar40 = vpbroadcastq_avx512f();
              auVar35 = vporq_avx512f(auVar40,auVar37);
              auVar40 = vporq_avx512f(auVar40,auVar38);
              uVar8 = vpcmpuq_avx512f(auVar40,auVar39,2);
              uVar9 = vpcmpuq_avx512f(auVar35,auVar39,2);
              bVar10 = (byte)uVar9;
              uVar30 = CONCAT11(bVar10,(byte)uVar8);
              auVar33 = vmovdqu16_avx512vl(*(undefined1 (*) [32])(*pauVar26 + uVar21 * 2));
              auVar34._2_2_ = (ushort)((byte)(uVar30 >> 1) & 1) * auVar33._2_2_;
              auVar34._0_2_ = (ushort)((byte)uVar8 & 1) * auVar33._0_2_;
              auVar34._4_2_ = (ushort)((byte)(uVar30 >> 2) & 1) * auVar33._4_2_;
              auVar34._6_2_ = (ushort)((byte)(uVar30 >> 3) & 1) * auVar33._6_2_;
              auVar34._8_2_ = (ushort)((byte)(uVar30 >> 4) & 1) * auVar33._8_2_;
              auVar34._10_2_ = (ushort)((byte)(uVar30 >> 5) & 1) * auVar33._10_2_;
              auVar34._12_2_ = (ushort)((byte)(uVar30 >> 6) & 1) * auVar33._12_2_;
              auVar34._14_2_ = (ushort)((byte)(uVar30 >> 7) & 1) * auVar33._14_2_;
              auVar34._16_2_ = (ushort)(bVar10 & 1) * auVar33._16_2_;
              auVar34._18_2_ = (ushort)(bVar10 >> 1 & 1) * auVar33._18_2_;
              auVar34._20_2_ = (ushort)(bVar10 >> 2 & 1) * auVar33._20_2_;
              auVar34._22_2_ = (ushort)(bVar10 >> 3 & 1) * auVar33._22_2_;
              auVar34._24_2_ = (ushort)(bVar10 >> 4 & 1) * auVar33._24_2_;
              auVar34._26_2_ = (ushort)(bVar10 >> 5 & 1) * auVar33._26_2_;
              auVar34._28_2_ = (ushort)(bVar10 >> 6 & 1) * auVar33._28_2_;
              auVar34._30_2_ = (ushort)(bVar10 >> 7) * auVar33._30_2_;
              auVar40 = vpmovzxwd_avx512f(auVar34);
              auVar40 = vpslld_avx512f(auVar40,0x10);
              auVar40 = vmovdqu32_avx512f(auVar40);
              *(undefined1 (*) [64])(*pauVar25 + uVar21 * 4) = auVar40;
              uVar21 = uVar21 + 0x10;
            } while (((ulong)(~uVar27 + uVar16) + 0x10 & 0x1fffffff0) != uVar21);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != iVar14);
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}